

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_string(lys_module *module,char **target,char *what,char *where,char *value,
                     lys_node *node)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = *target;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = lydict_insert_zc(module->ctx,value);
    *target = pcVar2;
  }
  else {
    ly_vlog(module->ctx,LYE_TOOMANY,(uint)(node != (lys_node *)0x0) * 2,node,what,where);
    free(value);
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

static int
yang_check_string(struct lys_module *module, const char **target, char *what,
                  char *where, char *value, struct lys_node *node)
{
    if (*target) {
        LOGVAL(module->ctx, LYE_TOOMANY, (node) ? LY_VLOG_LYS : LY_VLOG_NONE, node, what, where);
        free(value);
        return 1;
    } else {
        *target = lydict_insert_zc(module->ctx, value);
        return 0;
    }
}